

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

void __thiscall
chrono::ChStreamOstreamWrapper::Write(ChStreamOstreamWrapper *this,char *data,size_t n)

{
  std::ostream::write((char *)this->afile,(long)data);
  return;
}

Assistant:

void ChStreamOstreamWrapper::Write(const char* data, size_t n) {
    try {
        afile->write(data, n);
    } catch (const std::exception&) {
        throw ChException("Cannot write to wrapped stream");
    };
}